

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

void __thiscall Minisat::SimpSolver::removeClause(SimpSolver *this,CRef cr)

{
  uint *puVar1;
  int *piVar2;
  int i;
  ulong uVar3;
  int local_34;
  
  puVar1 = RegionAllocator<unsigned_int>::operator[](&(this->super_Solver).ca.ra,cr);
  if (this->use_simplification == true) {
    for (uVar3 = 0; uVar3 < *puVar1 >> 5; uVar3 = uVar3 + 1) {
      piVar2 = IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>::operator[]
                         (&(this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>,
                          (Lit)puVar1[uVar3 + 1]);
      *piVar2 = *piVar2 + -1;
      updateElimHeap(this,(int)puVar1[uVar3 + 1] >> 1);
      OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
      ::smudge(&this->occurs,&local_34);
    }
  }
  Solver::removeClause(&this->super_Solver,cr);
  return;
}

Assistant:

void SimpSolver::removeClause(CRef cr)
{
    const Clause& c = ca[cr];

    if (use_simplification)
        for (int i = 0; i < c.size(); i++){
            n_occ[c[i]]--;
            updateElimHeap(var(c[i]));
            occurs.smudge(var(c[i]));
        }

    Solver::removeClause(cr);
}